

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall crsGA::Logger::startProcessingMessages(Logger *this)

{
  Logger *local_30;
  code *local_28;
  undefined8 local_20;
  thread local_18;
  Logger *local_10;
  Logger *this_local;
  
  local_10 = this;
  std::atomic<bool>::operator=(&this->_exit,false);
  local_28 = processEntries;
  local_20 = 0;
  local_30 = this;
  std::thread::thread<void(crsGA::Logger::*)(),crsGA::Logger*,void>
            (&local_18,(type *)&local_28,&local_30);
  std::thread::operator=(&this->_thread,&local_18);
  std::thread::~thread(&local_18);
  return;
}

Assistant:

void Logger::startProcessingMessages()
{
    _exit = false;
    _thread = std::thread(&Logger::processEntries, this);
}